

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

void __thiscall gui::Timer::setCallback(Timer *this,function<void_(gui::Timer_*)> *callback)

{
  anon_union_32_2_3a3ae3dc_for_Callback<gui::Timer_*>_1 local_58;
  undefined4 local_38;
  _Any_data local_30;
  _Manager_type local_20;
  _Invoker_type p_Stack_18;
  
  std::function<void_(gui::Timer_*)>::function((function<void_(gui::Timer_*)> *)&local_30,callback);
  local_58._0_8_ = 0;
  local_58._8_8_ = 0;
  local_58.withArgs_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_58.withArgs_._M_invoker = p_Stack_18;
  if (local_20 != (_Manager_type)0x0) {
    local_58._0_8_ = local_30._M_unused._M_object;
    local_58._8_8_ = local_30._8_8_;
    local_58.withArgs_.super__Function_base._M_manager = local_20;
    local_20 = (_Manager_type)0x0;
    p_Stack_18 = (_Invoker_type)0x0;
  }
  local_38 = 0;
  swap(&this->callback_,(Callback<gui::Timer_*> *)&local_58.withArgs_);
  Callback<gui::Timer_*>::~Callback((Callback<gui::Timer_*> *)&local_58.withArgs_);
  if (local_20 != (_Manager_type)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return;
}

Assistant:

void Timer::setCallback(const std::function<void(Timer*)>& callback) {
    callback_ = callback;
}